

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CoverCrossSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverCrossSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::NamedLabelSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>const&,slang::syntax::CoverageIffClauseSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          NamedLabelSyntax **args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_3,
          CoverageIffClauseSyntax **args_4,Token *args_5,
          SyntaxList<slang::syntax::MemberSyntax> *args_6,Token *args_7,Token *args_8)

{
  Token cross;
  Token openBrace;
  Token closeBrace;
  Token emptySemi;
  CoverCrossSyntax *this_00;
  
  this_00 = (CoverCrossSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverCrossSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CoverCrossSyntax *)allocateSlow(this,0x110,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  cross.kind = args_2->kind;
  cross._2_1_ = args_2->field_0x2;
  cross.numFlags.raw = (args_2->numFlags).raw;
  cross.rawLen = args_2->rawLen;
  cross.info = args_2->info;
  emptySemi.kind = args_8->kind;
  emptySemi._2_1_ = args_8->field_0x2;
  emptySemi.numFlags.raw = (args_8->numFlags).raw;
  emptySemi.rawLen = args_8->rawLen;
  emptySemi.info = args_8->info;
  closeBrace.kind = args_7->kind;
  closeBrace._2_1_ = args_7->field_0x2;
  closeBrace.numFlags.raw = (args_7->numFlags).raw;
  closeBrace.rawLen = args_7->rawLen;
  closeBrace.info = args_7->info;
  openBrace.kind = args_5->kind;
  openBrace._2_1_ = args_5->field_0x2;
  openBrace.numFlags.raw = (args_5->numFlags).raw;
  openBrace.rawLen = args_5->rawLen;
  openBrace.info = args_5->info;
  slang::syntax::CoverCrossSyntax::CoverCrossSyntax
            (this_00,args,*args_1,cross,args_3,*args_4,openBrace,args_6,closeBrace,emptySemi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }